

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_symbol_codec.cpp
# Opt level: O3

bool __thiscall lzham::symbol_codec::encode_align_to_byte(symbol_codec *this)

{
  uint *puVar1;
  output_symbol *poVar2;
  bool bVar3;
  uint uVar4;
  
  uVar4 = (this->m_output_syms).m_size;
  if ((this->m_output_syms).m_capacity <= uVar4) {
    bVar3 = elemental_vector::increase_capacity
                      ((elemental_vector *)&this->m_output_syms,uVar4 + 1,true,8,(object_mover)0x0,
                       true);
    if (!bVar3) {
      return false;
    }
    uVar4 = (this->m_output_syms).m_size;
  }
  poVar2 = (this->m_output_syms).m_p + uVar4;
  poVar2->m_bits = 0;
  poVar2->m_num_bits = -2;
  poVar2->m_arith_prob0 = 0;
  puVar1 = &(this->m_output_syms).m_size;
  *puVar1 = *puVar1 + 1;
  return true;
}

Assistant:

bool symbol_codec::encode_align_to_byte()
   {
      LZHAM_ASSERT(m_mode == cEncoding);

      output_symbol sym;
      sym.m_bits = 0;
      sym.m_num_bits = output_symbol::cAlignToByteSym;
      sym.m_arith_prob0 = 0;
      if (!m_output_syms.try_push_back(sym))
         return false;

      return true;
   }